

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode output_auth_headers(connectdata *conn,auth *authstatus,char *request,char *path,_Bool proxy
                            )

{
  Curl_easy *data;
  unsigned_long uVar1;
  Curl_easy *data_00;
  long lVar2;
  byte bVar3;
  CURLcode CVar4;
  char *pcVar5;
  size_t insize;
  char **ppcVar6;
  char *pcVar7;
  char *pcVar8;
  char **ppcVar9;
  char *authorization;
  size_t size;
  char *local_48;
  long local_40;
  size_t local_38;
  
  data = conn->data;
  uVar1 = authstatus->picked;
  if (uVar1 != 1) {
    if (uVar1 == 2) {
      CVar4 = Curl_output_digest(conn,proxy,(uchar *)request,(uchar *)path);
      if (CVar4 != CURLE_OK) {
        return CVar4;
      }
      pcVar8 = "Digest";
    }
    else if (uVar1 == 8) {
      CVar4 = Curl_output_ntlm(conn,proxy);
      if (CVar4 != CURLE_OK) {
        return CVar4;
      }
      pcVar8 = "NTLM";
    }
    else {
      pcVar8 = (char *)0x0;
    }
    goto LAB_00111ea7;
  }
  if (proxy) {
    if (((conn->bits).proxy_user_passwd != true) ||
       (pcVar8 = Curl_checkProxyheaders(conn,"Proxy-authorization"), pcVar8 != (char *)0x0)) {
      if (!proxy) goto LAB_00111e70;
      goto LAB_00111e92;
    }
LAB_00111f8c:
    local_38 = 0;
    local_48 = (char *)0x0;
    data_00 = conn->data;
    ppcVar9 = &conn->user;
    ppcVar6 = &conn->passwd;
    local_40 = 0x430;
    if (proxy) {
      local_40 = 0x418;
      ppcVar6 = &(conn->http_proxy).passwd;
      ppcVar9 = &(conn->http_proxy).user;
    }
    pcVar8 = curl_maprintf("%s:%s",*ppcVar9,*ppcVar6);
    if (pcVar8 == (char *)0x0) {
      CVar4 = CURLE_OUT_OF_MEMORY;
    }
    else {
      insize = strlen(pcVar8);
      CVar4 = Curl_base64_encode(data_00,pcVar8,insize,&local_48,&local_38);
      lVar2 = local_40;
      if (CVar4 == CURLE_OK) {
        if (local_48 == (char *)0x0) {
          CVar4 = CURLE_REMOTE_ACCESS_DENIED;
        }
        else {
          (*Curl_cfree)(*(void **)((conn->chunk).hexbuffer + local_40 + -0x20));
          pcVar5 = "";
          if (proxy) {
            pcVar5 = "Proxy-";
          }
          pcVar5 = curl_maprintf("%sAuthorization: Basic %s\r\n",pcVar5,local_48);
          *(char **)((conn->chunk).hexbuffer + lVar2 + -0x20) = pcVar5;
          (*Curl_cfree)(local_48);
          CVar4 = CURLE_OUT_OF_MEMORY;
          if (*(long *)((conn->chunk).hexbuffer + lVar2 + -0x20) != 0) {
            CVar4 = CURLE_OK;
          }
        }
      }
      (*Curl_cfree)(pcVar8);
    }
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    pcVar8 = "Basic";
  }
  else {
LAB_00111e70:
    if (((conn->bits).user_passwd == true) &&
       (pcVar8 = Curl_checkheaders(conn,"Authorization"), pcVar8 == (char *)0x0)) goto LAB_00111f8c;
LAB_00111e92:
    pcVar8 = (char *)0x0;
  }
  authstatus->done = true;
LAB_00111ea7:
  if (authstatus->picked == 0x40) {
    if (((!proxy) && (conn->oauth_bearer != (char *)0x0)) &&
       (pcVar5 = Curl_checkheaders(conn,"Authorization:"), pcVar5 == (char *)0x0)) {
      (*Curl_cfree)((conn->allocptr).userpwd);
      pcVar8 = curl_maprintf("Authorization: Bearer %s\r\n",conn->oauth_bearer);
      (conn->allocptr).userpwd = pcVar8;
      if (pcVar8 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      pcVar8 = "Bearer";
    }
    authstatus->done = true;
  }
  if (pcVar8 == (char *)0x0) {
    bVar3 = false;
  }
  else {
    pcVar5 = "Server";
    ppcVar9 = &conn->user;
    if (proxy) {
      pcVar5 = "Proxy";
      ppcVar9 = &(conn->http_proxy).user;
    }
    pcVar7 = "";
    if (*ppcVar9 != (char *)0x0) {
      pcVar7 = *ppcVar9;
    }
    Curl_infof(data,"%s auth using %s with user \'%s\'\n",pcVar5,pcVar8,pcVar7);
    bVar3 = authstatus->done ^ 1;
  }
  authstatus->multipass = (_Bool)bVar3;
  return CURLE_OK;
}

Assistant:

static CURLcode
output_auth_headers(struct connectdata *conn,
                    struct auth *authstatus,
                    const char *request,
                    const char *path,
                    bool proxy)
{
  const char *auth = NULL;
  CURLcode result = CURLE_OK;
#if !defined(CURL_DISABLE_VERBOSE_STRINGS) || defined(USE_SPNEGO)
  struct Curl_easy *data = conn->data;
#endif
#ifdef USE_SPNEGO
  struct negotiatedata *negdata = proxy ?
    &data->state.proxyneg : &data->state.negotiate;
#endif

#ifdef CURL_DISABLE_CRYPTO_AUTH
  (void)request;
  (void)path;
#endif

#ifdef USE_SPNEGO
  negdata->state = GSS_AUTHNONE;
  if((authstatus->picked == CURLAUTH_NEGOTIATE) &&
     negdata->context && !GSS_ERROR(negdata->status)) {
    auth = "Negotiate";
    result = Curl_output_negotiate(conn, proxy);
    if(result)
      return result;
    authstatus->done = TRUE;
    negdata->state = GSS_AUTHSENT;
  }
  else
#endif
#ifdef USE_NTLM
  if(authstatus->picked == CURLAUTH_NTLM) {
    auth = "NTLM";
    result = Curl_output_ntlm(conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#if defined(USE_NTLM) && defined(NTLM_WB_ENABLED)
  if(authstatus->picked == CURLAUTH_NTLM_WB) {
    auth = "NTLM_WB";
    result = Curl_output_ntlm_wb(conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifndef CURL_DISABLE_CRYPTO_AUTH
  if(authstatus->picked == CURLAUTH_DIGEST) {
    auth = "Digest";
    result = Curl_output_digest(conn,
                                proxy,
                                (const unsigned char *)request,
                                (const unsigned char *)path);
    if(result)
      return result;
  }
  else
#endif
  if(authstatus->picked == CURLAUTH_BASIC) {
    /* Basic */
    if((proxy && conn->bits.proxy_user_passwd &&
        !Curl_checkProxyheaders(conn, "Proxy-authorization")) ||
       (!proxy && conn->bits.user_passwd &&
        !Curl_checkheaders(conn, "Authorization"))) {
      auth = "Basic";
      result = http_output_basic(conn, proxy);
      if(result)
        return result;
    }

    /* NOTE: this function should set 'done' TRUE, as the other auth
       functions work that way */
    authstatus->done = TRUE;
  }
  if(authstatus->picked == CURLAUTH_BEARER) {
    /* Bearer */
    if((!proxy && conn->oauth_bearer &&
        !Curl_checkheaders(conn, "Authorization:"))) {
      auth = "Bearer";
      result = http_output_bearer(conn);
      if(result)
        return result;
    }

    /* NOTE: this function should set 'done' TRUE, as the other auth
       functions work that way */
    authstatus->done = TRUE;
  }

  if(auth) {
    infof(data, "%s auth using %s with user '%s'\n",
          proxy ? "Proxy" : "Server", auth,
          proxy ? (conn->http_proxy.user ? conn->http_proxy.user : "") :
                  (conn->user ? conn->user : ""));
    authstatus->multipass = (!authstatus->done) ? TRUE : FALSE;
  }
  else
    authstatus->multipass = FALSE;

  return CURLE_OK;
}